

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O0

void pluslvl(boolean incr)

{
  schar sVar1;
  int iVar2;
  long lVar3;
  long tmp;
  int num;
  boolean incr_local;
  
  if (incr == '\0') {
    pline("You feel more experienced.");
  }
  iVar2 = newhp();
  u.uhpmax = iVar2 + u.uhpmax;
  u.uhp = iVar2 + u.uhp;
  if (u.umonnum != u.umonster) {
    iVar2 = rnd(8);
    u.mhmax = iVar2 + u.mhmax;
    u.mh = iVar2 + u.mh;
  }
  if (u.ulevel < urole.xlev) {
    sVar1 = acurr(2);
    iVar2 = rn2((int)sVar1 / 2 + (int)urole.enadv.lornd + (int)urace.enadv.lornd);
    tmp._0_4_ = iVar2 + (int)urole.enadv.lofix + (int)urace.enadv.lofix;
  }
  else {
    sVar1 = acurr(2);
    iVar2 = rn2((int)sVar1 / 2 + (int)urole.enadv.hirnd + (int)urace.enadv.hirnd);
    tmp._0_4_ = iVar2 + (int)urole.enadv.hifix + (int)urace.enadv.hifix;
  }
  iVar2 = enermod((int)tmp);
  u.uenmax = iVar2 + u.uenmax;
  u.uen = iVar2 + u.uen;
  if (u.ulevel < 0x1e) {
    if (incr == '\0') {
      lVar3 = newuexp(u.ulevel);
      u.uexp = (int)lVar3;
    }
    else {
      lVar3 = newuexp(u.ulevel + 1);
      if (lVar3 <= u.uexp) {
        u.uexp = (int)lVar3 + -1;
      }
    }
    u.ulevel = u.ulevel + 1;
    if (u.ulevelmax < u.ulevel) {
      u.ulevelmax = u.ulevel;
      historic_event('\0',"advanced to experience level %d.",(ulong)(uint)u.ulevel);
    }
    pline("Welcome to experience level %d.",(ulong)(uint)u.ulevel);
    adjabil(u.ulevel + -1,u.ulevel);
    reset_rndmonst(-1);
  }
  iflags.botl = '\x01';
  return;
}

Assistant:

void pluslvl(boolean incr)
{
	int num;

	if (!incr) pline("You feel more experienced.");
	num = newhp();
	u.uhpmax += num;
	u.uhp += num;
	if (Upolyd) {
	    num = rnd(8);
	    u.mhmax += num;
	    u.mh += num;
	}
	if (u.ulevel < urole.xlev)
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.lornd + urace.enadv.lornd,
			urole.enadv.lofix + urace.enadv.lofix);
	else
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.hirnd + urace.enadv.hirnd,
			urole.enadv.hifix + urace.enadv.hifix);
	num = enermod(num);	/* M. Stephenson */
	u.uenmax += num;
	u.uen += num;
	if (u.ulevel < MAXULEV) {
	    if (incr) {
		long tmp = newuexp(u.ulevel + 1);
		if (u.uexp >= tmp) u.uexp = tmp - 1;
	    } else {
		u.uexp = newuexp(u.ulevel);
	    }
	    ++u.ulevel;
	    if (u.ulevelmax < u.ulevel) {
		u.ulevelmax = u.ulevel;
		historic_event(FALSE, "advanced to experience level %d.", u.ulevel);
	    }
	    pline("Welcome to experience level %d.", u.ulevel);
	    adjabil(u.ulevel - 1, u.ulevel);	/* give new intrinsics */
	    reset_rndmonst(NON_PM);		/* new monster selection */
	}
	iflags.botl = 1;
}